

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::PropertyIdOnRegSlotsContainer::CreateRegSlotsArray
          (PropertyIdOnRegSlotsContainer *this,Recycler *recycler,uint _length)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *this_00;
  int *ptr;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if ((this->propertyIdsForRegSlots).ptr != (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x15fe,"(propertyIdsForRegSlots == nullptr)",
                                "propertyIdsForRegSlots == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_50 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x15ff;
  data.plusSize = (ulong)_length;
  this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
  ptr = Memory::AllocateArray<Memory::Recycler,int,false>
                  ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeafZero,0,(ulong)_length);
  Memory::WriteBarrierPtr<int>::WriteBarrierSet(&this->propertyIdsForRegSlots,ptr);
  this->length = _length;
  return;
}

Assistant:

void PropertyIdOnRegSlotsContainer::CreateRegSlotsArray(Recycler * recycler, uint _length)
    {
        Assert(propertyIdsForRegSlots == nullptr);
        propertyIdsForRegSlots = RecyclerNewArrayLeafZ(recycler, PropertyId, _length);
        length = _length;
    }